

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O0

void __thiscall lambda::parse_from::helper::comment(helper *this)

{
  int iVar1;
  Parse_error *this_00;
  Shared_string local_30;
  int local_14;
  helper *phStack_10;
  int_type ch;
  helper *this_local;
  
  phStack_10 = this;
  local_14 = std::istream::get();
  while ((local_14 != 0x2a || (iVar1 = std::istream::peek(), iVar1 != 0x29))) {
    if ((local_14 == 0x28) && (iVar1 = std::istream::peek(), iVar1 == 0x2a)) {
      std::istream::get();
      comment(this);
    }
    else {
      local_14 = std::istream::get();
      if (local_14 == -1) {
        this_00 = (Parse_error *)__cxa_allocate_exception(0x20);
        ublib::Shared_string::Shared_string(&local_30,"unexpected end of file");
        Parse_error::Parse_error(this_00,&local_30);
        __cxa_throw(this_00,&Parse_error::typeinfo,Parse_error::~Parse_error);
      }
    }
  }
  std::istream::get();
  return;
}

Assistant:

void comment() {
      auto ch = inp.get();
      for (;;) {
        if (ch == '*' and inp.peek() == ')') {
          inp.get();
          return;
        } else if (ch == '(' and inp.peek() == '*') {
          inp.get();
          comment();
        } else {
          ch = inp.get();
          if (ch == eof) {
            throw Parse_error("unexpected end of file");
          }
        }
      }
    }